

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TIntermediate::addUnaryMath
          (TIntermediate *this,TOperator op,TIntermTyped *child,TSourceLoc *loc)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int mc;
  int mr;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TIntermUnary *node;
  undefined4 extraout_var_07;
  long lVar5;
  undefined4 extraout_var_08;
  long *plVar6;
  TIntermTyped *pTVar7;
  TIntermediate *pTVar8;
  long lVar9;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong uVar10;
  undefined4 extraout_var_11;
  TBasicType local_dc;
  TType local_c8;
  
  if (child == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x1e])(child);
  pTVar8 = (TIntermediate *)CONCAT44(extraout_var,iVar3);
  iVar3 = (**(code **)(*(long *)pTVar8 + 0x38))();
  if (iVar3 == 0x10) {
    return (TIntermTyped *)0x0;
  }
  if ((int)op < 0x170) {
    if ((op - EOpPostIncrement < 4) || (op == EOpNegative)) {
      iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x1e])(child);
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x38))
                        ((long *)CONCAT44(extraout_var_00,iVar3));
      if (iVar3 == 0xf) {
        return (TIntermTyped *)0x0;
      }
      iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x1e])(child);
      pTVar8 = (TIntermediate *)CONCAT44(extraout_var_01,iVar3);
      cVar1 = (**(code **)(*(long *)pTVar8 + 0xe8))();
      if (cVar1 != '\0') {
        return (TIntermTyped *)0x0;
      }
    }
    else if (op == EOpLogicalNot) {
      if (this->source != EShSourceHlsl) {
        iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x1e])(child);
        iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x38))
                          ((long *)CONCAT44(extraout_var_02,iVar3));
        if (iVar3 != 0xc) {
          return (TIntermTyped *)0x0;
        }
        iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x1e])(child);
        cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0xe0))
                          ((long *)CONCAT44(extraout_var_03,iVar3));
        if (cVar1 != '\0') {
          return (TIntermTyped *)0x0;
        }
        iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x1e])(child);
        cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0xe8))
                          ((long *)CONCAT44(extraout_var_04,iVar3));
        if (cVar1 != '\0') {
          return (TIntermTyped *)0x0;
        }
        iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x1e])(child);
        pTVar8 = (TIntermediate *)CONCAT44(extraout_var_05,iVar3);
        cVar1 = (**(code **)(*(long *)pTVar8 + 0xd8))();
        if (cVar1 != '\0') {
          return (TIntermTyped *)0x0;
        }
      }
      goto LAB_00495d1d;
    }
  }
  else {
    switch(op) {
    case EOpConstructInt:
      local_dc = EbtInt;
      break;
    case EOpConstructUint:
      local_dc = EbtUint;
      break;
    case EOpConstructInt8:
      local_dc = EbtInt8;
      break;
    case EOpConstructUint8:
      local_dc = EbtUint8;
      break;
    case EOpConstructInt16:
      local_dc = EbtInt16;
      break;
    case EOpConstructUint16:
      local_dc = EbtUint16;
      break;
    case EOpConstructInt64:
      local_dc = EbtInt64;
      break;
    case EOpConstructUint64:
      local_dc = EbtUint64;
      break;
    case EOpConstructBool:
      local_dc = EbtBool;
      break;
    case EOpConstructFloat:
      local_dc = EbtFloat;
      break;
    case EOpConstructDouble:
      local_dc = EbtDouble;
      break;
    default:
      if (op != EOpConstructFloat16) goto LAB_00495ce5;
      local_dc = EbtFloat16;
    }
    iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x26])(child);
    mc = (*(child->super_TIntermNode)._vptr_TIntermNode[0x27])(child);
    mr = (*(child->super_TIntermNode)._vptr_TIntermNode[0x28])(child);
    iVar4 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x2b])(child);
    TType::TType(&local_c8,local_dc,EvqTemporary,iVar3,mc,mr,SUB41(iVar4,0));
    pTVar8 = this;
    child = addConversion(this,op,&local_c8,child);
    if (child == (TIntermTyped *)0x0) {
      return (TIntermTyped *)0x0;
    }
  }
LAB_00495ce5:
  if ((op - EOpConstructInt < 0xb) || (op == EOpConstructFloat16)) {
    iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[7])(child);
    plVar6 = (long *)CONCAT44(extraout_var_06,iVar3);
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x198))(plVar6);
      return child;
    }
    return child;
  }
LAB_00495d1d:
  node = addUnaryNode(pTVar8,op,child,loc);
  bVar2 = promote(this,&node->super_TIntermOperator);
  if (!bVar2) {
    return (TIntermTyped *)0x0;
  }
  (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x33])
            (node);
  iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x31])(node);
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x28))
                    ((long *)CONCAT44(extraout_var_07,iVar3));
  iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x31])(node);
  lVar9 = *(long *)CONCAT44(extraout_var_08,iVar3);
  if (lVar5 != 0) {
    plVar6 = (long *)(**(code **)(lVar9 + 0x28))();
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1e])(node);
    pTVar7 = (TIntermTyped *)(**(code **)(*plVar6 + 0x188))(plVar6,op,iVar3);
    return pTVar7;
  }
  pTVar8 = (TIntermediate *)(**(code **)(lVar9 + 0xf0))((long *)CONCAT44(extraout_var_08,iVar3));
  lVar9 = (**(code **)(*(long *)pTVar8 + 0x58))();
  if (((*(byte *)(lVar9 + 0xc) & 1) != 0) &&
     (bVar2 = isSpecializationOperation(pTVar8,&node->super_TIntermOperator), bVar2)) {
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1f])(node);
    lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar3) + 0x50))
                      ((long *)CONCAT44(extraout_var_09,iVar3));
    *(ulong *)(lVar9 + 8) = (*(ulong *)(lVar9 + 8) & 0xfffffffeffffff80) + 0x100000002;
  }
  iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x31])(node);
  lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar3) + 0x108))
                    ((long *)CONCAT44(extraout_var_10,iVar3));
  if ((*(byte *)(lVar9 + 0xc) & 2) == 0) {
    return (TIntermTyped *)node;
  }
  uVar10 = (ulong)(node->super_TIntermOperator).op;
  if (0x36 < uVar10) {
    return (TIntermTyped *)node;
  }
  if ((0x7ff79ffe00ff00U >> (uVar10 & 0x3f) & 1) != 0) {
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1f])(node);
    lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar3) + 0x50))
                      ((long *)CONCAT44(extraout_var_11,iVar3));
    *(ulong *)(lVar9 + 8) = *(ulong *)(lVar9 + 8) | 0x200000000;
    return (TIntermTyped *)node;
  }
  return (TIntermTyped *)node;
}

Assistant:

TIntermTyped* TIntermediate::addUnaryMath(TOperator op, TIntermTyped* child,
    const TSourceLoc& loc)
{
    if (child == nullptr)
        return nullptr;

    if (child->getType().getBasicType() == EbtBlock)
        return nullptr;

    switch (op) {
    case EOpLogicalNot:
        if (getSource() == EShSourceHlsl) {
            break; // HLSL can promote logical not
        }

        if (child->getType().getBasicType() != EbtBool || child->getType().isMatrix() || child->getType().isArray() || child->getType().isVector()) {
            return nullptr;
        }
        break;

    case EOpPostIncrement:
    case EOpPreIncrement:
    case EOpPostDecrement:
    case EOpPreDecrement:
    case EOpNegative:
        if (child->getType().getBasicType() == EbtStruct || child->getType().isArray())
            return nullptr;
        break;
    default: break; // some compilers want this
    }

    //
    // Do we need to promote the operand?
    //
    TBasicType newType = EbtVoid;
    switch (op) {
    case EOpConstructBool:   newType = EbtBool;   break;
    case EOpConstructFloat:  newType = EbtFloat;  break;
    case EOpConstructInt:    newType = EbtInt;    break;
    case EOpConstructUint:   newType = EbtUint;   break;
    case EOpConstructInt8:   newType = EbtInt8;   break;
    case EOpConstructUint8:  newType = EbtUint8;  break;
    case EOpConstructInt16:  newType = EbtInt16;  break;
    case EOpConstructUint16: newType = EbtUint16; break;
    case EOpConstructInt64:  newType = EbtInt64;  break;
    case EOpConstructUint64: newType = EbtUint64; break;
    case EOpConstructDouble: newType = EbtDouble; break;
    case EOpConstructFloat16: newType = EbtFloat16; break;
    default: break; // some compilers want this
    }

    if (newType != EbtVoid) {
        child = addConversion(op, TType(newType, EvqTemporary, child->getVectorSize(),
                                                               child->getMatrixCols(),
                                                               child->getMatrixRows(),
                                                               child->isVector()),
                              child);
        if (child == nullptr)
            return nullptr;
    }

    //
    // For constructors, we are now done, it was all in the conversion.
    // TODO: but, did this bypass constant folding?
    //
    switch (op) {
        case EOpConstructInt8:
        case EOpConstructUint8:
        case EOpConstructInt16:
        case EOpConstructUint16:
        case EOpConstructInt:
        case EOpConstructUint:
        case EOpConstructInt64:
        case EOpConstructUint64:
        case EOpConstructBool:
        case EOpConstructFloat:
        case EOpConstructDouble:
        case EOpConstructFloat16: {
            TIntermUnary* unary_node = child->getAsUnaryNode();
            if (unary_node != nullptr)
                unary_node->updatePrecision();
            return child;
        }
        default: break; // some compilers want this
    }

    //
    // Make a new node for the operator.
    //
    TIntermUnary* node = addUnaryNode(op, child, loc);

    if (! promote(node))
        return nullptr;

    node->updatePrecision();

    // If it's a (non-specialization) constant, it must be folded.
    if (node->getOperand()->getAsConstantUnion())
        return node->getOperand()->getAsConstantUnion()->fold(op, node->getType());

    // If it's a specialization constant, the result is too,
    // if the operation is allowed for specialization constants.
    if (node->getOperand()->getType().getQualifier().isSpecConstant() && isSpecializationOperation(*node))
        node->getWritableType().getQualifier().makeSpecConstant();

    // If must propagate nonuniform, make a nonuniform.
    if (node->getOperand()->getQualifier().isNonUniform() && isNonuniformPropagating(node->getOp()))
        node->getWritableType().getQualifier().nonUniform = true;

    return node;
}